

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.hpp
# Opt level: O3

void __thiscall
Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo::GLSLStubInfo
          (GLSLStubInfo *this,String *_Name,char *_Swizzle)

{
  pointer pcVar1;
  allocator local_19;
  
  (this->Name)._M_dataplus._M_p = (pointer)&(this->Name).field_2;
  pcVar1 = (_Name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + _Name->_M_string_length);
  std::__cxx11::string::string((string *)&this->Swizzle,_Swizzle,&local_19);
  return;
}

Assistant:

GLSLStubInfo(const String& _Name, const char* _Swizzle) :
            Name{_Name},
            Swizzle{_Swizzle}
        {}